

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,int>>,int>>>>
::operator()(void *this,char *value_text,
            node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
            *x)

{
  bool bVar1;
  UnorderedElementsAreMatcherImpl<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>
  *this_00;
  size_t sVar2;
  AssertionResult *other;
  node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
  *in_RCX;
  __normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>_>
  last;
  PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>
  *matcher_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  Matcher<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
  matcher;
  stringstream ss;
  StringMatchResultListener listener;
  undefined1 local_390 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
  local_360;
  undefined1 local_348 [16];
  pointer local_338;
  ios_base local_2c8 [264];
  undefined1 local_1c0 [32];
  VTable local_1a0 [3];
  ios_base local_130 [264];
  
  local_348._0_8_ = (pointer)0x0;
  local_348._8_8_ =
       (Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&> *)
       0x0;
  local_338 = (pointer)0x0;
  last._M_current =
       (Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&> *)
       in_RCX;
  std::
  vector<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
  ::reserve((vector<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
             *)local_348,1);
  MatcherCast<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>const&,testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,int>>,int>>
            ((Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>
              *)local_1c0,(testing *)value_text,matcher_00);
  std::
  vector<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
  ::push_back((vector<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
               *)local_348,(value_type *)local_1c0);
  MatcherBase<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>::
  ~MatcherBase((MatcherBase<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>
                *)local_1c0);
  this_00 = (UnorderedElementsAreMatcherImpl<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>
             *)operator_new(0x40);
  UnorderedElementsAreMatcherImpl<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>
  ::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>const&>*,std::vector<testing::Matcher<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>const&>,std::allocator<testing::Matcher<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>const&>>>>>
            (this_00,(Flags)local_348._0_8_,
             (__normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>_>
              )local_348._8_8_,last);
  local_360.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0020a600;
  local_360.buffer_.ptr = (void *)0x0;
  local_360.vtable_ =
       (VTable *)
       MatcherBase<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>
       ::
       GetVTable<testing::internal::MatcherBase<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>::ValuePolicy<testing::MatcherInterface<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>const*,true>>()
       ::kVTable;
  local_360.buffer_.ptr = operator_new(0x10);
  ((local_360.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(UnorderedElementsAreMatcherImpl<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>
    **)(local_360.buffer_.i + 8) = this_00;
  local_360.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0020a590;
  std::
  vector<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
  ::~vector((vector<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
             *)local_348);
  local_1c0._8_8_ = (VTable *)0x0;
  local_1c0._0_8_ = &PTR__MatchResultListener_0020a858;
  bVar1 = MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
          ::MatchAndExplain(&local_360,in_RCX,(MatchResultListener *)local_1c0);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_348);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"Value of: ",10);
    if (x == (node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
              *)0x0) {
      std::ios::clear((int)(ostream *)&local_338 +
                      (int)local_338[-1].
                           super_MatcherBase<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>
                           .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
    }
    else {
      sVar2 = strlen((char *)x);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,(char *)x,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"Expected: ",10);
    MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
    ::DescribeTo(&local_360,(ostream *)&local_338);
    local_1c0._8_8_ = local_1a0;
    local_1c0._0_8_ = &PTR__StringMatchResultListener_0020a8d0;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 0x10));
    bVar1 = MatchPrintAndExplain<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const,phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>
                      (in_RCX,(Matcher<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
                               *)&local_360,(MatchResultListener *)local_1c0);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_338,
                 "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                 ,0x60);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"\n  Actual: ",0xb);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_338,local_380._M_dataplus._M_p,local_380._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<((AssertionResult *)local_390,&local_380);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_388._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_388._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_1c0._0_8_ = &PTR__StringMatchResultListener_0020a8d0;
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 0x10));
    std::ios_base::~ios_base(local_130);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
    std::ios_base::~ios_base(local_2c8);
  }
  MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
  ::~MatcherBase(&local_360);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }